

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O3

string * __thiscall
glu::parseVariableName_abi_cxx11_(string *__return_storage_ptr__,glu *this,char *nameWithPath)

{
  TestError *this_00;
  VarTokenizer tokenizer;
  VarTokenizer local_28;
  
  local_28.m_token = TOKEN_LAST;
  local_28.m_tokenStart = 0;
  local_28.m_tokenLen = 0;
  local_28.m_str = (char *)this;
  VarTokenizer::advance(&local_28);
  if (local_28.m_token == TOKEN_IDENTIFIER) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,(glu *)(local_28.m_str + local_28.m_tokenStart),
               (glu *)(local_28.m_str + local_28.m_tokenStart) + local_28.m_tokenLen);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
             ,0x5d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string parseVariableName (const char* nameWithPath)
{
	VarTokenizer tokenizer(nameWithPath);
	TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
	return tokenizer.getIdentifier();
}